

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O3

bool HasGenericProperty<std::__cxx11::string>
               (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *list,char *szName)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  _Rb_tree_color _Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  uint uVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/GenericProperty.h"
                  ,0x7a,
                  "bool HasGenericProperty(const std::map<unsigned int, T> &, const char *) [T = std::basic_string<char>]"
                 );
  }
  sVar3 = strlen(szName);
  uVar2 = (uint)sVar3;
  uVar8 = 0;
  if (3 < uVar2) {
    uVar1 = uVar2 >> 2;
    uVar8 = 0;
    do {
      uVar8 = (*(ushort *)szName + uVar8) * 0x10000 ^
              (uint)*(ushort *)((long)szName + 2) << 0xb ^ *(ushort *)szName + uVar8;
      szName = (char *)((long)szName + 4);
      uVar8 = (uVar8 >> 0xb) + uVar8;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  switch(uVar2 & 3) {
  case 0:
    goto switchD_00396eb9_caseD_0;
  case 1:
    uVar8 = uVar8 + (int)(char)*(ushort *)szName;
    uVar2 = uVar8 * 0x400 ^ uVar8;
    uVar8 = uVar2 >> 1;
    break;
  case 2:
    uVar2 = (uVar8 + *(ushort *)szName) * 0x800 ^ uVar8 + *(ushort *)szName;
    uVar8 = uVar2 >> 0x11;
    break;
  case 3:
    uVar8 = (uVar8 + *(ushort *)szName) * 0x10000 ^
            (int)(char)*(ushort *)((long)szName + 2) << 0x12 ^ uVar8 + *(ushort *)szName;
    uVar2 = uVar8 >> 0xb;
  }
  uVar8 = uVar8 + uVar2;
switchD_00396eb9_caseD_0:
  p_Var4 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &(list->_M_t)._M_impl.super__Rb_tree_header;
  p_Var9 = &p_Var7->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    uVar8 = uVar8 * 8 ^ uVar8;
    uVar8 = (uVar8 >> 5) + uVar8;
    uVar8 = uVar8 * 0x10 ^ uVar8;
    uVar8 = (uVar8 >> 0x11) + uVar8;
    uVar8 = uVar8 * 0x2000000 ^ uVar8;
    _Var5 = (uVar8 >> 6) + uVar8;
    p_Var6 = &p_Var7->_M_header;
    do {
      bVar10 = p_Var4[1]._M_color < _Var5;
      if (!bVar10) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar10];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var7) && (p_Var9 = p_Var6, _Var5 < p_Var6[1]._M_color)) {
      p_Var9 = &p_Var7->_M_header;
    }
  }
  return (_Rb_tree_header *)p_Var9 != p_Var7;
}

Assistant:

inline
bool HasGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return false;
    }

    return true;
}